

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall
GlobOptBlockData::MergeBlockData
          (GlobOptBlockData *this,BasicBlock *toBlock,BasicBlock *fromBlock,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge,bool forceTypeSpecOnLoopHeader)

{
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar1
  ;
  GlobOptBlockData *fromData;
  StackLiteralInitFldData *value;
  ushort uVar2;
  uint uVar3;
  BVIndex BVar4;
  int iVar5;
  StackSym *pSVar6;
  CapturedValues *pCVar7;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar8
  ;
  Loop *pLVar9;
  Type pBVar10;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *other;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *other_00;
  StackLiteralInitFldDataMap *this_00;
  Type pSVar11;
  code *pcVar12;
  bool bVar13;
  int iVar14;
  undefined4 *puVar15;
  Type *pTVar16;
  Type *pTVar17;
  Type *pTVar18;
  Type *pTVar19;
  Value *pVVar20;
  BVSparse<Memory::JitArenaAllocator> *pBVar21;
  StackSym *pSVar22;
  Value *pVVar23;
  anon_union_8_3_5e50e90d_for_u aVar24;
  BVSparse<Memory::JitArenaAllocator> *pBVar25;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  anon_union_8_3_5e50e90d_for_u *paVar26;
  anon_union_8_3_5e50e90d_for_u aVar27;
  Type pJVar28;
  ulong uVar29;
  Type_conflict pBVar30;
  BasicBlock *pBVar31;
  Type_conflict pBVar32;
  ulong uVar33;
  SymID id;
  Type TVar34;
  anon_union_8_3_5e50e90d_for_u aVar35;
  StackLiteralInitFldDataMap *toMap;
  ValueType *this_02;
  bool bVar36;
  anon_union_8_3_5e50e90d_for_u aStack_c8;
  Iterator iterFrom;
  anon_union_8_3_5e50e90d_for_u aStack_a8;
  int i;
  JitArenaAllocator *local_98;
  anon_union_8_3_5e50e90d_for_u *local_90;
  anon_union_8_3_5e50e90d_for_u aStack_88;
  Iterator iterFrom_1;
  anon_union_8_3_5e50e90d_for_u local_68;
  anon_union_8_3_5e50e90d_for_u aStack_60;
  JitArenaAllocator *local_58;
  anon_union_8_3_5e50e90d_for_u *local_50;
  BasicBlock *local_48;
  GlobOptBlockData *local_40;
  BasicBlock *local_38;
  
  fromData = &fromBlock->globOptData;
  local_40 = (GlobOptBlockData *)symsCreatedForMerge;
  bVar13 = GlobOpt::DoBoundCheckHoist(this->globOpt);
  if (bVar13) {
    GlobOpt::MergeBoundCheckHoistBlockData(this->globOpt,toBlock,this,fromBlock,fromData);
  }
  uVar2 = *(ushort *)&toBlock->field_0x18;
  MergeValueMaps(this,toBlock,fromBlock,symsRequiringCompensation,
                 (BVSparse<Memory::JitArenaAllocator> *)local_40);
  local_48 = toBlock;
  GlobOpt::InsertCloneStrs(this->globOpt,toBlock,this,fromData);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveFields,(fromBlock->globOptData).liveFields);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveArrayValues,(fromBlock->globOptData).liveArrayValues);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->isTempSrc,(fromBlock->globOptData).isTempSrc);
  this->hasCSECandidates =
       (bool)(this->hasCSECandidates & (fromBlock->globOptData).hasCSECandidates);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this->changedSyms,(fromBlock->globOptData).changedSyms);
  aVar35 = (anon_union_8_3_5e50e90d_for_u)this->capturedValues;
  aVar27 = (anon_union_8_3_5e50e90d_for_u)(fromBlock->globOptData).capturedValues;
  local_40 = this;
  local_38 = fromBlock;
  if (aVar35 == (anon_union_8_3_5e50e90d_for_u)0x0) {
    this->capturedValues = (CapturedValues *)aVar27;
    if (aVar27 != (anon_union_8_3_5e50e90d_for_u)0x0) {
      CapturedValues::IncrementRefCount((CapturedValues *)aVar27);
    }
  }
  else {
    aStack_a8 = aVar35;
    aStack_c8 = aVar27;
    iterFrom.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)aVar27;
    aVar24 = *(anon_union_8_3_5e50e90d_for_u *)aVar35;
    bVar36 = false;
    bVar13 = aVar24 != aVar35;
    _i = (anon_union_8_3_5e50e90d_for_u)0x0;
    if (bVar13) {
      _i = aVar24;
    }
    if (aVar27 != (anon_union_8_3_5e50e90d_for_u)0x0) {
      bVar36 = (anon_union_8_3_5e50e90d_for_u)*(sIntConst *)aVar27 != aVar27;
      iterFrom.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)(anon_union_8_3_5e50e90d_for_u)0x0;
      if (bVar36) {
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)*(sIntConst *)aVar27;
      }
      if (aVar24 != aVar35 && bVar36) {
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          pTVar16 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)&aStack_c8.intConst);
          pSVar22 = pTVar16->key;
          pTVar16 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)&aStack_a8.intConst);
          pSVar6 = pTVar16->key;
          uVar3 = (pSVar22->super_Sym).m_id;
          BVar4 = (pSVar6->super_Sym).m_id;
          if (uVar3 < BVar4) {
            BVSparse<Memory::JitArenaAllocator>::Set(local_40->changedSyms,uVar3);
            if (iterFrom.list ==
                (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar13) goto LAB_00491809;
              *puVar15 = 0;
            }
            iterFrom.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  *)((iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            bVar36 = (anon_union_8_3_5e50e90d_for_u)iterFrom.list != aStack_c8;
            if (!bVar36) {
              iterFrom.list =
                   (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
            }
            bVar13 = true;
          }
          else if (BVar4 < uVar3) {
            BVSparse<Memory::JitArenaAllocator>::Set(local_40->changedSyms,BVar4);
            if (_i == (anon_union_8_3_5e50e90d_for_u)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar13) goto LAB_00491809;
              *puVar15 = 0;
            }
            _i = *(anon_union_8_3_5e50e90d_for_u *)_i;
            bVar13 = _i != aStack_a8;
            if (!bVar13) {
              _i = (anon_union_8_3_5e50e90d_for_u)0x0;
            }
            bVar36 = true;
          }
          else {
            pTVar16 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)&aStack_c8.intConst);
            pTVar17 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)&aStack_a8.intConst);
            if ((pTVar16->key->super_Sym).m_id != (pTVar17->key->super_Sym).m_id) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                  ,0x1d1,"(symValueFrom->Key()->m_id == symValueTo->Key()->m_id)",
                                  "symValueFrom->Key()->m_id == symValueTo->Key()->m_id");
              if (!bVar13) goto LAB_00491809;
              *puVar15 = 0;
            }
            aStack_60 = (pTVar16->value).u;
            local_68.intConst.value._0_1_ = (pTVar16->value).type;
            iterFrom_1.list =
                 *(SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   **)&(pTVar17->value).u;
            aStack_88.intConst.value._0_1_ = (pTVar17->value).type;
            bVar13 = BailoutConstantValue::IsEqual
                               ((BailoutConstantValue *)&local_68.intConst,
                                (BailoutConstantValue *)&aStack_88.intConst);
            if (!bVar13) {
              BVSparse<Memory::JitArenaAllocator>::Set
                        (local_40->changedSyms,(pSVar6->super_Sym).m_id);
            }
            if (iterFrom.list ==
                (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar13) goto LAB_00491809;
              *puVar15 = 0;
            }
            iterFrom.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  *)((iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            bVar36 = (anon_union_8_3_5e50e90d_for_u)iterFrom.list != aStack_c8;
            if (!bVar36) {
              iterFrom.list =
                   (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
            }
            if (_i == (anon_union_8_3_5e50e90d_for_u)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar13) goto LAB_00491809;
              *puVar15 = 0;
            }
            _i = *(anon_union_8_3_5e50e90d_for_u *)_i;
            bVar13 = _i != aStack_a8;
            if (!bVar13) {
              _i = (anon_union_8_3_5e50e90d_for_u)0x0;
            }
          }
        } while ((bVar36) && (bVar13));
      }
    }
    if ((bVar36) || (bVar13)) {
      paVar26 = &aStack_a8;
      if (bVar36) {
        paVar26 = &aStack_c8;
      }
      local_68 = *paVar26;
      aStack_60 = paVar26[1];
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        pTVar16 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)&local_68.intConst);
        BVSparse<Memory::JitArenaAllocator>::Set
                  (local_40->changedSyms,(pTVar16->key->super_Sym).m_id);
        if (aStack_60 == (anon_union_8_3_5e50e90d_for_u)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar13 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar13) goto LAB_00491809;
          *puVar15 = 0;
        }
        aStack_60 = *(anon_union_8_3_5e50e90d_for_u *)aStack_60;
      } while (aStack_60 != local_68);
    }
    local_68 = (anon_union_8_3_5e50e90d_for_u)&local_40->capturedValues->copyPropSyms;
    pCVar7 = (local_38->globOptData).capturedValues;
    pSVar1 = &pCVar7->copyPropSyms;
    aStack_88 = (anon_union_8_3_5e50e90d_for_u)pSVar1;
    if (pCVar7 == (CapturedValues *)0x0) {
      aStack_88 = (anon_union_8_3_5e50e90d_for_u)0x0;
    }
    iterFrom_1.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)aStack_88;
    aVar35 = (anon_union_8_3_5e50e90d_for_u)
             (local_40->capturedValues->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.
             next;
    bVar13 = false;
    bVar36 = aVar35 != local_68;
    aStack_60 = (anon_union_8_3_5e50e90d_for_u)0x0;
    if (bVar36) {
      aStack_60 = aVar35;
    }
    if (pCVar7 != (CapturedValues *)0x0) {
      pSVar8 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)(pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next;
      bVar13 = pSVar8 != pSVar1;
      iterFrom_1.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
      if (bVar13) {
        iterFrom_1.list = pSVar8;
      }
      if (aVar35 != local_68 && bVar13) {
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          pTVar18 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)&aStack_88.intConst);
          pSVar22 = pTVar18->key;
          pTVar18 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)&local_68.intConst);
          pSVar6 = pTVar18->key;
          uVar3 = (pSVar22->super_Sym).m_id;
          BVar4 = (pSVar6->super_Sym).m_id;
          if (uVar3 < BVar4) {
            BVSparse<Memory::JitArenaAllocator>::Set(local_40->changedSyms,uVar3);
            if (iterFrom_1.list ==
                (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar13) goto LAB_00491809;
              *puVar15 = 0;
            }
            iterFrom_1.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  *)((iterFrom_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            bVar13 = (anon_union_8_3_5e50e90d_for_u)iterFrom_1.list != aStack_88;
            if (!bVar13) {
              iterFrom_1.list =
                   (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
            }
            bVar36 = true;
          }
          else if (BVar4 < uVar3) {
            BVSparse<Memory::JitArenaAllocator>::Set(local_40->changedSyms,BVar4);
            if (aStack_60 == (anon_union_8_3_5e50e90d_for_u)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar13) goto LAB_00491809;
              *puVar15 = 0;
            }
            aStack_60 = *(anon_union_8_3_5e50e90d_for_u *)aStack_60;
            bVar36 = aStack_60 != local_68;
            if (!bVar36) {
              aStack_60 = (anon_union_8_3_5e50e90d_for_u)0x0;
            }
            bVar13 = true;
          }
          else {
            pTVar18 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)&aStack_88.intConst);
            pTVar19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)&local_68.intConst);
            if ((pTVar18->key->super_Sym).m_id != (pTVar19->key->super_Sym).m_id) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                  ,0x1da,
                                  "(copyPropSymFrom->Key()->m_id == copyPropSymTo->Key()->m_id)",
                                  "copyPropSymFrom->Key()->m_id == copyPropSymTo->Key()->m_id");
              if (!bVar13) goto LAB_00491809;
              *puVar15 = 0;
            }
            if ((pTVar18->value->super_Sym).m_id == (pTVar19->value->super_Sym).m_id) {
              pVVar23 = FindValue(fromData,&pTVar18->key->super_Sym);
              pVVar20 = FindValue(local_40,&pTVar18->key->super_Sym);
              if ((pVVar20 == (Value *)0x0 || pVVar23 == (Value *)0x0) ||
                 (pVVar23->valueNumber != pVVar20->valueNumber)) goto LAB_004908a9;
            }
            else {
LAB_004908a9:
              BVSparse<Memory::JitArenaAllocator>::Set
                        (local_40->changedSyms,(pSVar6->super_Sym).m_id);
            }
            if (iterFrom_1.list ==
                (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar13) goto LAB_00491809;
              *puVar15 = 0;
            }
            iterFrom_1.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  *)((iterFrom_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            bVar13 = (anon_union_8_3_5e50e90d_for_u)iterFrom_1.list != aStack_88;
            if (!bVar13) {
              iterFrom_1.list =
                   (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
            }
            if (aStack_60 == (anon_union_8_3_5e50e90d_for_u)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar36 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar36) goto LAB_00491809;
              *puVar15 = 0;
            }
            aStack_60 = *(anon_union_8_3_5e50e90d_for_u *)aStack_60;
            bVar36 = aStack_60 != local_68;
            if (!bVar36) {
              aStack_60 = (anon_union_8_3_5e50e90d_for_u)0x0;
            }
          }
        } while ((bVar13) && (bVar36));
      }
    }
    if ((bVar13) || (this = local_40, bVar36)) {
      paVar26 = &local_68;
      if (bVar13) {
        paVar26 = &aStack_88;
      }
      aStack_a8 = *paVar26;
      _i = paVar26[1];
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      aVar35 = _i;
      do {
        _i = aVar35;
        pTVar18 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)&aStack_a8.intConst);
        BVSparse<Memory::JitArenaAllocator>::Set
                  (local_40->changedSyms,(pTVar18->key->super_Sym).m_id);
        if (_i == (anon_union_8_3_5e50e90d_for_u)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar13 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar13) goto LAB_00491809;
          *puVar15 = 0;
        }
        this = local_40;
        aVar35 = *(anon_union_8_3_5e50e90d_for_u *)_i;
      } while (*(anon_union_8_3_5e50e90d_for_u *)_i != aStack_a8);
    }
  }
  pBVar25 = (local_38->globOptData).maybeWrittenTypeSyms;
  pBVar31 = local_38;
  if (pBVar25 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (this->maybeWrittenTypeSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar21 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->globOpt->alloc,0x3eba5c);
      pBVar31 = local_38;
      pJVar28 = this->globOpt->alloc;
      pBVar21->head = (Type_conflict)0x0;
      pBVar21->lastFoundIndex = (Type_conflict)0x0;
      pBVar21->alloc = pJVar28;
      pBVar21->lastUsedNodePrevNextField = (Type)pBVar21;
      this->maybeWrittenTypeSyms = pBVar21;
      pBVar25 = (local_38->globOptData).maybeWrittenTypeSyms;
      BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar25);
      BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
                (pBVar21,pBVar25->head);
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->maybeWrittenTypeSyms,pBVar25);
      pBVar31 = local_38;
    }
  }
  local_98 = this->globOpt->tempAlloc;
  local_50 = &local_68;
  local_68 = (anon_union_8_3_5e50e90d_for_u)0x0;
  aStack_60 = (anon_union_8_3_5e50e90d_for_u)0x0;
  aStack_88 = (anon_union_8_3_5e50e90d_for_u)0x0;
  iterFrom_1.list =
       (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *
       )0x0;
  iterFrom_1.current = (NodeBase *)local_98;
  local_58 = local_98;
  if (forceTypeSpecOnLoopHeader && (uVar2 & 4) != 0) {
    pLVar9 = local_48->loop;
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
               (pBVar31->globOptData).liveInt32Syms,(pBVar31->globOptData).liveLossyInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,this->liveInt32Syms,
               this->liveLossyInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
               (BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
               pLVar9->likelyIntSymsUsedBeforeDefined);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,this->liveVarSyms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this->liveInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (this->liveLossyInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst);
    bVar13 = GlobOpt::DoLossyIntTypeSpec(this->globOpt);
    if (bVar13) {
      BVSparse<Memory::JitArenaAllocator>::Minus
                ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
                 (local_38->globOptData).liveInt32Syms,this->liveInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
                 pLVar9->symsUsedBeforeDefined);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,this->liveVarSyms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->liveInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->liveLossyInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst)
      ;
    }
    BVSparse<Memory::JitArenaAllocator>::And
              ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
               (local_38->globOptData).liveFloat64Syms,pLVar9->forceFloat64SymsOnEntry);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this->liveFloat64Syms,(BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst);
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
               (local_38->globOptData).liveFloat64Syms,this->liveFloat64Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
               pLVar9->likelyNumberSymsUsedBeforeDefined);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this->liveFloat64Syms,(BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst);
    local_98 = this->globOpt->tempAlloc;
    pBVar31 = local_38;
  }
  local_90 = &aStack_a8;
  aStack_a8 = (anon_union_8_3_5e50e90d_for_u)0x0;
  _i = (anon_union_8_3_5e50e90d_for_u)0x0;
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,
             (pBVar31->globOptData).liveInt32Syms,(pBVar31->globOptData).liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
             (local_38->globOptData).liveVarSyms,
             (BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,this->liveVarSyms,
             this->liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
             (BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_a8.intConst,this->liveInt32Syms,
             this->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,this->liveVarSyms,
             (BVSparse<Memory::JitArenaAllocator> *)&aStack_a8.intConst);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_a8.intConst,
             (local_38->globOptData).liveVarSyms,(local_38->globOptData).liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_a8.intConst,
             (local_38->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,
             (BVSparse<Memory::JitArenaAllocator> *)&aStack_a8.intConst);
  iterFrom.current = (NodeBase *)this->globOpt->tempAlloc;
  aStack_c8 = (anon_union_8_3_5e50e90d_for_u)0x0;
  iterFrom.list =
       (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
        *)0x0;
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_a8.intConst,
             (BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
             (local_38->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_c8.intConst,
             (BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_a8.intConst,
             (BVSparse<Memory::JitArenaAllocator> *)&aStack_c8.intConst);
  if (aStack_c8 != (anon_union_8_3_5e50e90d_for_u)0x0) {
    aVar35 = aStack_c8;
    aVar27 = *(anon_union_8_3_5e50e90d_for_u *)(iterFrom.current + 0x10);
    do {
      aVar24 = aVar35;
      aVar35 = *(anon_union_8_3_5e50e90d_for_u *)aVar24;
      *(anon_union_8_3_5e50e90d_for_u *)aVar24 = aVar27;
      aVar27 = aVar24;
    } while (aVar35 != (anon_union_8_3_5e50e90d_for_u)0x0);
    *(anon_union_8_3_5e50e90d_for_u *)(iterFrom.current + 0x10) = aVar24;
  }
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
             (local_38->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
             (BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveVarSyms,(local_38->globOptData).liveVarSyms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this->liveVarSyms,(BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst);
  aVar35 = aStack_a8;
  if (aStack_a8 != (anon_union_8_3_5e50e90d_for_u)0x0) {
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      uVar29 = *(ulong *)((long)aVar35 + 0x10);
      if (uVar29 != 0) {
        iVar14 = *(int *)((long)aVar35 + 8);
        uVar33 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar33);
          id = iVar14 + (BVIndex)uVar33;
          pSVar22 = SymTable::FindStackSym(local_40->globOpt->func->m_symTable,id);
          if (pSVar22 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                ,0x270,"(stackSym)","stackSym");
            if (!bVar13) goto LAB_00491809;
            *puVar15 = 0;
          }
          pVVar23 = FindValue(local_40,&pSVar22->super_Sym);
          if (pVVar23 != (Value *)0x0) {
            this_02 = &pVVar23->valueInfo->super_ValueType;
            bVar13 = ValueType::IsInt(this_02);
            if ((bVar13) ||
               ((bVar13 = ValueType::IsLikelyInt(this_02), bVar13 &&
                (bVar13 = GlobOpt::DoAggressiveIntTypeSpec(local_40->globOpt), bVar13)))) {
              BVSparse<Memory::JitArenaAllocator>::Set(local_40->liveVarSyms,id);
            }
          }
          uVar29 = uVar29 & ~(1L << (uVar33 & 0x3f));
          uVar33 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
            }
          }
        } while (uVar29 != 0);
      }
      aVar35 = *(anon_union_8_3_5e50e90d_for_u *)aVar35;
    } while (aVar35 != (anon_union_8_3_5e50e90d_for_u)0x0);
    this = local_40;
    if (aStack_a8 != (anon_union_8_3_5e50e90d_for_u)0x0) {
      aVar35 = aStack_a8;
      aVar27 = (anon_union_8_3_5e50e90d_for_u)local_98->bvFreeList;
      do {
        aVar24 = aVar35;
        aVar35 = *(anon_union_8_3_5e50e90d_for_u *)aVar24;
        *(anon_union_8_3_5e50e90d_for_u *)aVar24 = aVar27;
        aVar27 = aVar24;
      } while (aVar35 != (anon_union_8_3_5e50e90d_for_u)0x0);
      local_98->bvFreeList = (BVSparseNode *)aVar24;
    }
  }
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,this->liveInt32Syms,
             this->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
             (local_38->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,
             (local_38->globOptData).liveInt32Syms,(local_38->globOptData).liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,
             (local_38->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Or
            (this->liveFloat64Syms,(BVSparse<Memory::JitArenaAllocator> *)&local_68.intConst,
             (BVSparse<Memory::JitArenaAllocator> *)&aStack_88.intConst);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveInt32Syms,(local_38->globOptData).liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this->liveLossyInt32Syms,(local_38->globOptData).liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveLossyInt32Syms,this->liveInt32Syms);
  if (aStack_88 != (anon_union_8_3_5e50e90d_for_u)0x0) {
    aVar35 = aStack_88;
    aVar27 = *(anon_union_8_3_5e50e90d_for_u *)(iterFrom_1.current + 0x10);
    do {
      aVar24 = aVar35;
      aVar35 = *(anon_union_8_3_5e50e90d_for_u *)aVar24;
      *(anon_union_8_3_5e50e90d_for_u *)aVar24 = aVar27;
      aVar27 = aVar24;
    } while (aVar35 != (anon_union_8_3_5e50e90d_for_u)0x0);
    *(anon_union_8_3_5e50e90d_for_u *)(iterFrom_1.current + 0x10) = aVar24;
  }
  if (local_68 != (anon_union_8_3_5e50e90d_for_u)0x0) {
    aVar35 = local_68;
    aVar27 = (anon_union_8_3_5e50e90d_for_u)local_58->bvFreeList;
    do {
      aVar24 = aVar35;
      aVar35 = *(anon_union_8_3_5e50e90d_for_u *)aVar24;
      *(anon_union_8_3_5e50e90d_for_u *)aVar24 = aVar27;
      aVar27 = aVar24;
    } while (aVar35 != (anon_union_8_3_5e50e90d_for_u)0x0);
    local_58->bvFreeList = (BVSparseNode *)aVar24;
  }
  bVar13 = GlobOpt::TrackArgumentsObject(this->globOpt);
  if ((bVar13) &&
     (bVar13 = BVSparse<Memory::JitArenaAllocator>::Equal
                         (this->argObjSyms,(local_38->globOptData).argObjSyms), !bVar13)) {
    GlobOpt::CannotAllocateArgumentsObjectOnStack(this->globOpt,(Func *)0x0);
  }
  pBVar25 = (local_38->globOptData).maybeTempObjectSyms;
  pBVar21 = pBVar25;
  if (pBVar25 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_0049121b:
    pBVar25 = (local_38->globOptData).canStoreTempObjectSyms;
    if (pBVar25 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      do {
        pBVar25 = (BVSparse<Memory::JitArenaAllocator> *)pBVar25->head;
        if (pBVar25 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0049128f;
      } while (((Type *)&pBVar25->alloc)->word == 0);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar15 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                          ,0x2b5,
                          "(!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty())"
                          ,
                          "!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty()"
                         );
      if (!bVar13) goto LAB_00491809;
      *puVar15 = 0;
    }
LAB_0049128f:
    pBVar25 = this->canStoreTempObjectSyms;
    if (pBVar25 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      if (pBVar25->head != (Type_conflict)0x0) {
        pJVar28 = pBVar25->alloc;
        pBVar10 = pBVar25->head;
        pBVar30 = pJVar28->bvFreeList;
        do {
          pBVar32 = pBVar10;
          pBVar10 = pBVar32->next;
          pBVar32->next = pBVar30;
          pBVar30 = pBVar32;
        } while (pBVar10 != (Type)0x0);
LAB_0049134d:
        pJVar28->bvFreeList = pBVar32;
      }
LAB_00491358:
      pBVar25->head = (Type_conflict)0x0;
      pBVar25->lastFoundIndex = (Type_conflict)0x0;
      pBVar25->lastUsedNodePrevNextField = &pBVar25->head;
    }
  }
  else {
    do {
      pBVar21 = (BVSparse<Memory::JitArenaAllocator> *)pBVar21->head;
      if (pBVar21 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0049121b;
    } while (((Type *)&pBVar21->alloc)->word == 0);
    if (this->maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar25 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pBVar25,this->globOpt->alloc);
      this->maybeTempObjectSyms = pBVar25;
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->maybeTempObjectSyms,pBVar25);
    }
    pBVar25 = (local_38->globOptData).canStoreTempObjectSyms;
    pBVar21 = pBVar25;
    if (pBVar25 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_00491320:
      pBVar25 = this->canStoreTempObjectSyms;
      if (pBVar25 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        if (pBVar25->head != (Type_conflict)0x0) {
          pJVar28 = pBVar25->alloc;
          pBVar10 = pBVar25->head;
          pBVar30 = pJVar28->bvFreeList;
          do {
            pBVar32 = pBVar10;
            pBVar10 = pBVar32->next;
            pBVar32->next = pBVar30;
            pBVar30 = pBVar32;
          } while (pBVar10 != (Type)0x0);
          goto LAB_0049134d;
        }
        goto LAB_00491358;
      }
    }
    else {
      do {
        pBVar21 = (BVSparse<Memory::JitArenaAllocator> *)pBVar21->head;
        if (pBVar21 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00491320;
      } while (((Type *)&pBVar21->alloc)->word == 0);
      if (this->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                  (this->canStoreTempObjectSyms,pBVar25);
      }
    }
  }
  if (this->curFunc != (local_38->globOptData).curFunc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,700,"(this->curFunc == fromData->curFunc)",
                        "this->curFunc == fromData->curFunc");
    if (!bVar13) goto LAB_00491809;
    *puVar15 = 0;
  }
  other = (local_38->globOptData).callSequence;
  if ((this->callSequence != (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0 ||
       other != (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
     (bVar13 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Equals
                         (this->callSequence,other), !bVar13)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2bd,
                        "((this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence)))"
                        ,
                        "(this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence))"
                       );
    if (!bVar13) goto LAB_00491809;
    *puVar15 = 0;
  }
  if (this->startCallCount != (local_38->globOptData).startCallCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2be,"(this->startCallCount == fromData->startCallCount)",
                        "this->startCallCount == fromData->startCallCount");
    if (!bVar13) goto LAB_00491809;
    *puVar15 = 0;
  }
  if (this->argOutCount != (local_38->globOptData).argOutCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2bf,"(this->argOutCount == fromData->argOutCount)",
                        "this->argOutCount == fromData->argOutCount");
    if (!bVar13) goto LAB_00491809;
    *puVar15 = 0;
  }
  if (this->totalOutParamCount != (local_38->globOptData).totalOutParamCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2c0,"(this->totalOutParamCount == fromData->totalOutParamCount)",
                        "this->totalOutParamCount == fromData->totalOutParamCount");
    if (!bVar13) goto LAB_00491809;
    *puVar15 = 0;
  }
  if (this->inlinedArgOutSize != (local_38->globOptData).inlinedArgOutSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar15 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2c1,"(this->inlinedArgOutSize == fromData->inlinedArgOutSize)",
                        "this->inlinedArgOutSize == fromData->inlinedArgOutSize");
    if (!bVar13) {
LAB_00491809:
      pcVar12 = (code *)invalidInstructionException();
      (*pcVar12)();
    }
    *puVar15 = 0;
  }
  other_00 = (local_38->globOptData).stackLiteralInitFldDataMap;
  if ((other_00 !=
       (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0) &&
     ((this->globOpt->prePassLoop == (Loop *)0x0 ||
      (((local_48->field_0x18 & 4) != 0 && (local_48->loop == this->globOpt->rootLoopPrePass)))))) {
    this_00 = this->stackLiteralInitFldDataMap;
    if (this_00 == (StackLiteralInitFldDataMap *)0x0) {
      this_01 = (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::JitArenaAllocator>(0x38,other_00->alloc,0x3eba5c);
      JsUtil::
      BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_01,other_00);
      this->stackLiteralInitFldDataMap = this_01;
    }
    else {
      TVar34 = other_00->bucketCount;
      if (TVar34 != 0) {
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        local_40 = (GlobOptBlockData *)0x0;
        do {
          iVar14 = other_00->buckets[(long)local_40];
          if (iVar14 != -1) {
            do {
              pSVar11 = other_00->entries;
              value = (StackLiteralInitFldData *)(pSVar11 + iVar14);
              iVar5 = pSVar11[iVar14].
                      super_DefaultHashedEntry<StackSym_*,_StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                      .super_KeyValueEntry<StackSym_*,_StackLiteralInitFldData>.
                      super_ValueEntry<StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>_>
                      .super_KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>.next;
              local_68 = (anon_union_8_3_5e50e90d_for_u)
                         pSVar11[iVar14].
                         super_DefaultHashedEntry<StackSym_*,_StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .super_KeyValueEntry<StackSym_*,_StackLiteralInitFldData>.
                         super_ValueEntry<StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>_>
                         .super_KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>.key;
              iVar14 = JsUtil::
                       BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                       ::
                       Insert<(JsUtil::BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                                 ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                   *)this_00,(StackSym **)&local_68,value);
              if (iVar14 == -1) {
                bVar13 = JsUtil::
                         BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                         ::TryGetReference<StackSym*>
                                   ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                     *)this_00,(StackSym **)&local_68,
                                    (StackLiteralInitFldData **)&aStack_88,(int *)&aStack_a8);
                if (!bVar13) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar15 = 1;
                  bVar13 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                      ,0x2d6,"(toMap->TryGetReference(stackSym, &currentData))",
                                      "toMap->TryGetReference(stackSym, &currentData)");
                  if (!bVar13) goto LAB_00491809;
                  *puVar15 = 0;
                }
                if (((RealCount *)((long)aStack_88 + 8))->count != value->currentInitFldCount) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar15 = 1;
                  bVar13 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                      ,0x2d7,
                                      "(currentData->currentInitFldCount == data.currentInitFldCount)"
                                      ,
                                      "currentData->currentInitFldCount == data.currentInitFldCount"
                                     );
                  if (!bVar13) goto LAB_00491809;
                  *puVar15 = 0;
                }
                if (*(PropertyIdArray **)aStack_88 != value->propIds) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar15 = 1;
                  bVar13 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                      ,0x2d8,"(currentData->propIds == data.propIds)",
                                      "currentData->propIds == data.propIds");
                  if (!bVar13) goto LAB_00491809;
                  *puVar15 = 0;
                }
              }
              iVar14 = iVar5;
            } while (iVar5 != -1);
            TVar34 = other_00->bucketCount;
          }
          local_40 = (GlobOptBlockData *)((long)&local_40->symToValueMap + 1);
        } while (local_40 < (GlobOptBlockData *)(ulong)TVar34);
      }
    }
  }
  return;
}

Assistant:

void
GlobOptBlockData::MergeBlockData(
    BasicBlock *toBlock,
    BasicBlock *fromBlock,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge,
    bool forceTypeSpecOnLoopHeader)
{
    GlobOptBlockData *fromData = &(fromBlock->globOptData);

    if(this->globOpt->DoBoundCheckHoist())
    {
        // Do this before merging values so that it can see whether a sym's value was changed on one side or the other
        this->globOpt->MergeBoundCheckHoistBlockData(toBlock, this, fromBlock, fromData);
    }

    bool isLoopBackEdge = toBlock->isLoopHeader;
    this->MergeValueMaps(toBlock, fromBlock, symsRequiringCompensation, symsCreatedForMerge);

    this->globOpt->InsertCloneStrs(toBlock, this, fromData);

    this->liveFields->And(fromData->liveFields);
    this->liveArrayValues->And(fromData->liveArrayValues);
    this->isTempSrc->And(fromData->isTempSrc);
    this->hasCSECandidates &= fromData->hasCSECandidates;

    this->changedSyms->Or(fromData->changedSyms);
    if (this->capturedValues == nullptr)
    {
        this->capturedValues = fromData->capturedValues;
        if (this->capturedValues)
        {
            this->capturedValues->IncrementRefCount();
        }
    }
    else
    {
        this->MergeCapturedValues(
            &this->capturedValues->constantValues,
            fromData->capturedValues == nullptr ? nullptr : &fromData->capturedValues->constantValues,
            [&](ConstantStackSymValue * symValueFrom, ConstantStackSymValue * symValueTo)
            {
                Assert(symValueFrom->Key()->m_id == symValueTo->Key()->m_id);
                return symValueFrom->Value().IsEqual(symValueTo->Value());
            });

        this->MergeCapturedValues(
            &this->capturedValues->copyPropSyms,
            fromData->capturedValues == nullptr ? nullptr : &fromData->capturedValues->copyPropSyms,
            [&](CopyPropSyms * copyPropSymFrom, CopyPropSyms * copyPropSymTo)
            {
                Assert(copyPropSymFrom->Key()->m_id == copyPropSymTo->Key()->m_id);
                if (copyPropSymFrom->Value()->m_id == copyPropSymTo->Value()->m_id)
                {
                    Value * fromVal = fromData->FindValue(copyPropSymFrom->Key());
                    Value * toVal = this->FindValue(copyPropSymFrom->Key());
                    return fromVal && toVal && fromVal->IsEqualTo(toVal);
                }
                return false;
            });
    }

    if (fromData->maybeWrittenTypeSyms)
    {
        if (this->maybeWrittenTypeSyms == nullptr)
        {
            this->maybeWrittenTypeSyms = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
            this->maybeWrittenTypeSyms->Copy(fromData->maybeWrittenTypeSyms);
        }
        else
        {
            this->maybeWrittenTypeSyms->Or(fromData->maybeWrittenTypeSyms);
        }
    }

    {
        // - Keep the var sym live if any of the following is true:
        //     - The var sym is live on both sides
        //     - The var sym is the only live sym that contains the lossless value of the sym on a side (that is, the lossless
        //       int32 sym is not live, and the float64 sym is not live on that side), and the sym of any type is live on the
        //       other side
        //     - On a side, the var and float64 syms are live, the lossless int32 sym is not live, the sym's merged value is
        //       likely int, and the sym of any type is live on the other side. Since the value is likely int, it may be
        //       int-specialized (with lossless conversion) later. Keeping only the float64 sym live requires doing a lossless
        //       conversion from float64 to int32, with bailout if the value of the float is not a true 32-bit integer. Checking
        //       that is costly, and if the float64 sym is converted back to var, it does not become a tagged int, causing a
        //       guaranteed bailout if a lossless conversion to int happens later. Keep the var sym live to preserve its
        //       tagged-ness so that it can be int-specialized while avoiding unnecessary bailouts.
        // - Keep the int32 sym live if it's live on both sides
        //     - Mark the sym as lossy if it's lossy on any side
        // - Keep the float64 sym live if it's live on a side and the sym of a specialized lossless type is live on the other
        //   side
        //
        // fromData.temp =
        //     (fromData.var - (fromData.int32 - fromData.lossyInt32)) &
        //     (this.var | this.int32 | this.float64)
        // this.temp =
        //     (this.var - (this.int32 - this.lossyInt32)) &
        //     (fromData.var | fromData.int32 | fromData.float64)
        // this.var =
        //     (fromData.var & this.var) |
        //     (fromData.temp - fromData.float64) |
        //     (this.temp - this.float64) |
        //     (fromData.temp & fromData.float64 | this.temp & this.float64) & (value ~ int)
        //
        // this.float64 =
        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64) |
        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        // this.int32 &= fromData.int32
        // this.lossyInt32 = (fromData.lossyInt32 | this.lossyInt32) & this.int32

        BVSparse<JitArenaAllocator> tempBv1(this->globOpt->tempAlloc);
        BVSparse<JitArenaAllocator> tempBv2(this->globOpt->tempAlloc);

        if (isLoopBackEdge && forceTypeSpecOnLoopHeader)
        {
            Loop *const loop = toBlock->loop;

            // Force to lossless int32:
            // forceLosslessInt32 =
            //     ((fromData.int32 - fromData.lossyInt32) - (this.int32 - this.lossyInt32)) &
            //     loop.likelyIntSymsUsedBeforeDefined &
            //     this.var
            tempBv1.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
            tempBv2.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
            tempBv1.Minus(&tempBv2);
            tempBv1.And(loop->likelyIntSymsUsedBeforeDefined);
            tempBv1.And(this->liveVarSyms);
            this->liveInt32Syms->Or(&tempBv1);
            this->liveLossyInt32Syms->Minus(&tempBv1);

            if(this->globOpt->DoLossyIntTypeSpec())
            {
                // Force to lossy int32:
                // forceLossyInt32 = (fromData.int32 - this.int32) & loop.symsUsedBeforeDefined & this.var
                tempBv1.Minus(fromData->liveInt32Syms, this->liveInt32Syms);
                tempBv1.And(loop->symsUsedBeforeDefined);
                tempBv1.And(this->liveVarSyms);
                this->liveInt32Syms->Or(&tempBv1);
                this->liveLossyInt32Syms->Or(&tempBv1);
            }

            // Force to float64:
            // forceFloat64 =
            //     fromData.float64 & loop.forceFloat64 |
            //     (fromData.float64 - this.float64) & loop.likelyNumberSymsUsedBeforeDefined
            tempBv1.And(fromData->liveFloat64Syms, loop->forceFloat64SymsOnEntry);
            this->liveFloat64Syms->Or(&tempBv1);
            tempBv1.Minus(fromData->liveFloat64Syms, this->liveFloat64Syms);
            tempBv1.And(loop->likelyNumberSymsUsedBeforeDefined);
            this->liveFloat64Syms->Or(&tempBv1);
        }

        {
            BVSparse<JitArenaAllocator> tempBv3(this->globOpt->tempAlloc);

            // fromData.temp =
            //     (fromData.var - (fromData.int32 - fromData.lossyInt32)) &
            //     (this.var | this.int32 | this.float64)
            tempBv2.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
            tempBv1.Minus(fromData->liveVarSyms, &tempBv2);
            tempBv2.Or(this->liveVarSyms, this->liveInt32Syms);
            tempBv2.Or(this->liveFloat64Syms);
            tempBv1.And(&tempBv2);

            // this.temp =
            //     (this.var - (this.int32 - this.lossyInt32)) &
            //     (fromData.var | fromData.int32 | fromData.float64)
            tempBv3.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
            tempBv2.Minus(this->liveVarSyms, &tempBv3);
            tempBv3.Or(fromData->liveVarSyms, fromData->liveInt32Syms);
            tempBv3.Or(fromData->liveFloat64Syms);
            tempBv2.And(&tempBv3);

            {
                BVSparse<JitArenaAllocator> tempBv4(this->globOpt->tempAlloc);

                // fromData.temp & fromData.float64 | this.temp & this.float64
                tempBv3.And(&tempBv1, fromData->liveFloat64Syms);
                tempBv4.And(&tempBv2, this->liveFloat64Syms);
                tempBv3.Or(&tempBv4);
            }

            //     (fromData.temp - fromData.float64) |
            //     (this.temp - this.float64)
            tempBv1.Minus(fromData->liveFloat64Syms);
            tempBv2.Minus(this->liveFloat64Syms);
            tempBv1.Or(&tempBv2);

            // this.var =
            //     (fromData.var & this.var) |
            //     (fromData.temp - fromData.float64) |
            //     (this.temp - this.float64)
            this->liveVarSyms->And(fromData->liveVarSyms);
            this->liveVarSyms->Or(&tempBv1);

            // this.var |=
            //     (fromData.temp & fromData.float64 | this.temp & this.float64) & (value ~ int)
            FOREACH_BITSET_IN_SPARSEBV(id, &tempBv3)
            {
                StackSym *const stackSym = this->globOpt->func->m_symTable->FindStackSym(id);
                Assert(stackSym);
                Value *const value = this->FindValue(stackSym);
                if(value)
                {
                    ValueInfo *const valueInfo = value->GetValueInfo();
                    if(valueInfo->IsInt() || (valueInfo->IsLikelyInt() && this->globOpt->DoAggressiveIntTypeSpec()))
                    {
                        this->liveVarSyms->Set(id);
                    }
                }
            } NEXT_BITSET_IN_SPARSEBV;
        }

        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64)
        tempBv1.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
        tempBv1.Or(this->liveFloat64Syms);
        tempBv1.And(fromData->liveFloat64Syms);

        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        tempBv2.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
        tempBv2.Or(fromData->liveFloat64Syms);
        tempBv2.And(this->liveFloat64Syms);

        // this.float64 =
        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64) |
        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        this->liveFloat64Syms->Or(&tempBv1, &tempBv2);

        // this.int32 &= fromData.int32
        // this.lossyInt32 = (fromData.lossyInt32 | this.lossyInt32) & this.int32
        this->liveInt32Syms->And(fromData->liveInt32Syms);
        this->liveLossyInt32Syms->Or(fromData->liveLossyInt32Syms);
        this->liveLossyInt32Syms->And(this->liveInt32Syms);
    }

    if (this->globOpt->TrackArgumentsObject())
    {
        if (!this->argObjSyms->Equal(fromData->argObjSyms))
        {
            this->globOpt->CannotAllocateArgumentsObjectOnStack(nullptr);
        }
    }

    if (fromData->maybeTempObjectSyms && !fromData->maybeTempObjectSyms->IsEmpty())
    {
        if (this->maybeTempObjectSyms)
        {
            this->maybeTempObjectSyms->Or(fromData->maybeTempObjectSyms);
        }
        else
        {
            this->maybeTempObjectSyms = fromData->maybeTempObjectSyms->CopyNew(this->globOpt->alloc);
        }

        if (fromData->canStoreTempObjectSyms && !fromData->canStoreTempObjectSyms->IsEmpty())
        {
            if (this->canStoreTempObjectSyms)
            {
                // Both need to be temp object
                this->canStoreTempObjectSyms->And(fromData->canStoreTempObjectSyms);
            }
        }
        else if (this->canStoreTempObjectSyms)
        {
            this->canStoreTempObjectSyms->ClearAll();
        }
    }
    else
    {
        Assert(!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty());
        if (this->canStoreTempObjectSyms)
        {
            this->canStoreTempObjectSyms->ClearAll();
        }
    }

    Assert(this->curFunc == fromData->curFunc);
    Assert((this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence)));
    Assert(this->startCallCount == fromData->startCallCount);
    Assert(this->argOutCount == fromData->argOutCount);
    Assert(this->totalOutParamCount == fromData->totalOutParamCount);
    Assert(this->inlinedArgOutSize == fromData->inlinedArgOutSize);

    // stackLiteralInitFldDataMap is a union of the stack literal from two path.
    // Although we don't need the data on loop prepass, we need to do it for the loop header
    // because we capture the loop header bailout on loop prepass.
    if (fromData->stackLiteralInitFldDataMap != nullptr &&
        (!this->globOpt->IsLoopPrePass() || (toBlock->isLoopHeader && toBlock->loop == this->globOpt->rootLoopPrePass)))
    {
        if (this->stackLiteralInitFldDataMap == nullptr)
        {
            this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap->Clone();
        }
        else
        {
            StackLiteralInitFldDataMap * toMap = this->stackLiteralInitFldDataMap;
            fromData->stackLiteralInitFldDataMap->Map([toMap](StackSym * stackSym, StackLiteralInitFldData const& data)
            {
                if (toMap->AddNew(stackSym, data) == -1)
                {
                    // If there is an existing data for the stackSym, both path should match
                    DebugOnly(StackLiteralInitFldData const * currentData);
                    Assert(toMap->TryGetReference(stackSym, &currentData));
                    Assert(currentData->currentInitFldCount == data.currentInitFldCount);
                    Assert(currentData->propIds == data.propIds);
                }
            });
        }
    }
}